

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

void open_history_cb(Fl_Widget *param_1,void *v)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (modflag != 0) {
    pcVar5 = "Do you want to save changes to this user\ninterface before opening another one?";
    iVar2 = fl_choice("Do you want to save changes to this user\ninterface before opening another one?"
                      ,"Cancel","Save","Don\'t Save");
    if (iVar2 == 0) {
      return;
    }
    if ((iVar2 == 1) && (save_cb((Fl_Widget *)pcVar5,(void *)0x0), modflag != 0)) {
      return;
    }
  }
  pcVar5 = filename;
  filename = (char *)0x0;
  set_filename((char *)v);
  undo_suspend();
  iVar2 = read_file(filename,0);
  if (iVar2 == 0) {
    undo_resume();
    undo_clear();
    pcVar1 = filename;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fl_message("Can\'t read %s: %s",pcVar1,pcVar4);
    free(filename);
    filename = pcVar5;
    if (main_window != (Fl_Window *)0x0) {
      Fl_Window::label(main_window,pcVar5);
      return;
    }
  }
  else {
    set_modflag(0);
    undo_resume();
    undo_clear();
    if (pcVar5 != (char *)0x0) {
      free(pcVar5);
      return;
    }
  }
  return;
}

Assistant:

void open_history_cb(Fl_Widget *, void *v) {
  if (modflag) {
    switch (fl_choice("Do you want to save changes to this user\n"
                      "interface before opening another one?", "Cancel",
                      "Save", "Don't Save"))
    {
      case 0 : /* Cancel */
          return;
      case 1 : /* Save */
          save_cb(NULL, NULL);
	  if (modflag) return;	// Didn't save!
    }
  }
  const char *oldfilename = filename;
  filename = NULL;
  set_filename((char *)v);
  undo_suspend();
  if (!read_file(filename, 0)) {
    undo_resume();
    undo_clear();
    fl_message("Can't read %s: %s", filename, strerror(errno));
    free((void *)filename);
    filename = oldfilename;
    if (main_window) main_window->label(filename);
    return;
  }
  set_modflag(0);
  undo_resume();
  undo_clear();
  if (oldfilename) free((void *)oldfilename);
}